

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O2

Get_constant_factor_result __thiscall
lossless_neural_sound::expression_compiler::expression::Product::get_constant_factor
          (Product *this,Arena *arena,Nodes *nodes)

{
  Expression_node **__src;
  _func_int **pp_Var1;
  Expression_node *pEVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Get_constant_factor_result GVar5;
  vector<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
  factors;
  _func_int **local_40;
  _Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
  local_38;
  
  uVar3 = 0;
  uVar4 = 0x3ff00000;
  pEVar2 = (Expression_node *)this;
  do {
    pEVar2 = (Expression_node *)pEVar2[1].super_Node._vptr_Node;
    if (pEVar2 == (Expression_node *)0x0) goto LAB_0011ee2c;
    pp_Var1 = (pEVar2->super_Node)._vptr_Node;
  } while (pp_Var1 == (_func_int **)&PTR__Node_0012e8f0);
  if (pp_Var1 == (_func_int **)&PTR__Node_0012e760) {
    local_38._M_impl.super__Vector_impl_data._M_start = (Expression_node **)0x0;
    local_38._M_impl.super__Vector_impl_data._M_finish = (Expression_node **)0x0;
    local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>::
    visit_leaves<lossless_neural_sound::expression_compiler::expression::Product::get_constant_factor(lossless_neural_sound::expression_compiler::Arena&,lossless_neural_sound::expression_compiler::expression::Nodes&)const::_lambda(lossless_neural_sound::expression_compiler::expression::Expression_node_const*)_1_>
              (&this->
                super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>
               ,(vector<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
                 *)&local_38);
    if ((ulong)((long)local_38._M_impl.super__Vector_impl_data._M_finish -
               (long)local_38._M_impl.super__Vector_impl_data._M_start) < 9) {
      __assert_fail("factors.size() >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/programmerjake[P]lossless_neural_sound/src/expression_compiler/expression.h"
                    ,0x4dd,
                    "virtual Get_constant_factor_result lossless_neural_sound::expression_compiler::expression::Product::get_constant_factor(Arena &, Nodes &) const"
                   );
    }
    if ((long)local_38._M_impl.super__Vector_impl_data._M_finish -
        (long)local_38._M_impl.super__Vector_impl_data._M_start == 0x10) {
      local_40 = pEVar2[1].super_Node._vptr_Node;
      this = (Product *)local_38._M_impl.super__Vector_impl_data._M_finish[-1];
    }
    else {
      __src = local_38._M_impl.super__Vector_impl_data._M_start + 1;
      if (__src != local_38._M_impl.super__Vector_impl_data._M_finish) {
        memmove(local_38._M_impl.super__Vector_impl_data._M_start,__src,
                (long)local_38._M_impl.super__Vector_impl_data._M_finish - (long)__src);
      }
      local_38._M_impl.super__Vector_impl_data._M_finish =
           local_38._M_impl.super__Vector_impl_data._M_finish + -1;
      local_40 = pEVar2[1].super_Node._vptr_Node;
      this = (Product *)
             Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>::
             make_tree<>(arena,nodes,local_38._M_impl.super__Vector_impl_data._M_start,
                         (long)local_38._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_38._M_impl.super__Vector_impl_data._M_start >> 3);
    }
    std::
    _Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
    ::~_Vector_base(&local_38);
    uVar3 = SUB84(local_40,0);
    uVar4 = (undefined4)((ulong)local_40 >> 0x20);
  }
LAB_0011ee2c:
  GVar5.constant_factor._4_4_ = uVar4;
  GVar5.constant_factor._0_4_ = uVar3;
  GVar5.rest = (Expression_node *)this;
  return GVar5;
}

Assistant:

virtual Get_constant_factor_result get_constant_factor(Arena &arena,
                                                           Nodes &nodes) const override
    {
        auto *front = left_node;
        while(auto *node = dynamic_cast<const Product *>(front))
            front = node->left_node;
        if(auto *constant = dynamic_cast<const Constant *>(front))
        {
            std::vector<const Expression_node *> factors;
            visit_leaves([&](const Expression_node *factor)
                         {
                             factors.push_back(factor);
                         });
            assert(factors.size() >= 2);
            if(factors.size() == 2)
                return {constant->value, factors.back()};
            factors.erase(factors.begin());
            return {constant->value, make_tree(arena, nodes, factors.data(), factors.size())};
        }
        return {1, this};
    }